

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

void __thiscall
pbrt::
InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
::reserve(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
          *this,size_t n)

{
  memory_resource *pmVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  size_t sVar6;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar7;
  ParsedParameter **ppPVar5;
  
  uVar4 = 8;
  if (this->ptr != (ParsedParameter **)0x0) {
    uVar4 = this->nAlloc;
  }
  if (uVar4 < n) {
    if (n * 8 == 0) {
      ppPVar5 = (ParsedParameter **)0x0;
    }
    else {
      pmVar1 = (this->alloc).memoryResource;
      iVar3 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 8,8);
      ppPVar5 = (ParsedParameter **)CONCAT44(extraout_var,iVar3);
    }
    sVar2 = this->nStored;
    if (sVar2 != 0) {
      sVar6 = 0;
      do {
        paVar7 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                  *)this->ptr;
        if ((anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
             *)this->ptr ==
            (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
             *)0x0) {
          paVar7 = &this->field_2;
        }
        ppPVar5[sVar6] = paVar7->fixed[sVar6];
        sVar6 = sVar6 + 1;
      } while (sVar2 != sVar6);
    }
    if (this->ptr != (ParsedParameter **)0x0) {
      pmVar1 = (this->alloc).memoryResource;
      (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc << 3,8);
    }
    this->nAlloc = n;
    this->ptr = ppPVar5;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (capacity() >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }